

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomBuilder.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *__s;
  undefined1 auVar2 [16];
  pointer ppCVar3;
  size_type sVar4;
  pointer ppCVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  LatticeFactory *this;
  SimInfo *pSVar9;
  pointer pdVar10;
  pointer pVVar11;
  MoLocator *this_00;
  _Base_ptr p_Var12;
  DumpWriter *this_01;
  size_t __i;
  double *pdVar13;
  pointer pVVar14;
  _Base_ptr p_Var15;
  Molecule *mol;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  _Rb_tree_header *p_Var20;
  long lVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  vector<double,_std::allocator<double>_> molFractions;
  vector<int,_std::allocator<int>_> nMol;
  int remaining;
  vector<int,_std::allocator<int>_> ids;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> sites;
  vector<double,_std::allocator<double>_> molecularMasses;
  vector<double,_std::allocator<double>_> lc;
  string latticeType;
  RealType latticeConstant;
  string outputFileName;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> orientations;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> latticePos;
  string inputFileName;
  vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> components;
  SimCreator newCreator;
  SimCreator oldCreator;
  Mat3x3d hmat;
  gengetopt_args_info args_info;
  random_device rd;
  mt19937 gen;
  vector<double,_std::allocator<double>_> local_2ac8;
  vector<int,_std::allocator<int>_> local_2aa8;
  double local_2a88;
  int local_2a7c;
  undefined1 local_2a78 [24];
  _func_int **local_2a60;
  Lattice *local_2a58;
  ulong local_2a50;
  vector<int,_std::allocator<int>_> local_2a48;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_2a28;
  vector<double,_std::allocator<double>_> local_2a08;
  pointer local_29f0;
  ulong local_29e8;
  int local_29dc;
  void *local_29d8;
  iterator iStack_29d0;
  double *local_29c8;
  string local_29c0;
  pointer local_29a0;
  SimInfo *local_2998;
  double local_2990;
  string local_2988;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_2968;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_2948;
  string local_2928;
  vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_> local_2908;
  SimCreator local_28f0;
  vector<int,_std::allocator<int>_> local_28c8;
  SimCreator local_28b0;
  Mat3x3d local_2888;
  gengetopt_args_info local_2838;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  OpenMD::registerLattice();
  local_29c0._M_dataplus._M_p = (pointer)&local_29c0.field_2;
  local_29c0._M_string_length = 0;
  local_29c0.field_2._M_local_buf[0] = '\0';
  local_2928._M_dataplus._M_p = (pointer)&local_2928.field_2;
  local_2928._M_string_length = 0;
  local_2928.field_2._M_local_buf[0] = '\0';
  local_2988._M_dataplus._M_p = (pointer)&local_2988.field_2;
  local_2988._M_string_length = 0;
  local_2988.field_2._M_local_buf[0] = '\0';
  local_29c8 = (double *)0x0;
  local_29d8 = (void *)0x0;
  iStack_29d0._M_current = (double *)0x0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_2948.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2948.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2948.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar7 = cmdline_parser(argc,argv,&local_2838);
  if (iVar7 != 0) {
    exit(1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_29c0,0,(char *)local_29c0._M_string_length,0x28f090);
  sVar4 = local_29c0._M_string_length;
  if (local_2838.lattice_given != 0) {
    strlen(local_2838.lattice_arg);
    std::__cxx11::string::_M_replace
              ((ulong)&local_29c0,0,(char *)sVar4,(ulong)local_2838.lattice_arg);
  }
  this = OpenMD::LatticeFactory::getInstance();
  local_2a58 = OpenMD::LatticeFactory::createLattice(this,&local_29c0);
  if (local_2a58 == (Lattice *)0x0) {
    snprintf(painCave.errMsg,2000,"Lattice Factory can not create %s lattice\n",
             local_29c0._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  local_2a50 = (ulong)(uint)local_2a58->nCellSites;
  if (local_2838.nx_arg < 1) {
    memcpy(&painCave,"The number of unit cells in the x direction must be greater than 0.",0x44);
    painCave.isFatal = 1;
    simError();
  }
  if (local_2838.ny_arg < 1) {
    memcpy(&painCave,"The number of unit cells in the y direction must be greater than 0.",0x44);
    painCave.isFatal = 1;
    simError();
  }
  if (local_2838.nz_arg < 1) {
    memcpy(&painCave,"The number of unit cells in the z direction must be greater than 0.",0x44);
    painCave.isFatal = 1;
    simError();
  }
  sVar4 = local_2928._M_string_length;
  if (local_2838.inputs_num == 0) {
    builtin_strncpy(painCave.errMsg + 0x30,"mand line",10);
    builtin_strncpy(painCave.errMsg + 0x20,"ified on the com",0x10);
    builtin_strncpy(painCave.errMsg + 0x10,"le name was spec",0x10);
    builtin_strncpy(painCave.errMsg,"No input .omd fi",0x10);
    painCave.isFatal = 1;
    simError();
  }
  else {
    __s = *local_2838.inputs;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_2928,0,(char *)sVar4,(ulong)__s);
  }
  local_28b0.mdFileName_._M_dataplus._M_p = (pointer)&local_28b0.mdFileName_.field_2;
  local_2a60 = (_func_int **)&PTR__SimCreator_002fa198;
  local_28b0._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002fa198;
  local_28b0.mdFileName_._M_string_length = 0;
  local_28b0.mdFileName_.field_2._M_local_buf[0] = '\0';
  pSVar9 = OpenMD::SimCreator::createSim(&local_28b0,&local_2928,false);
  std::vector<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>::vector
            (&local_2908,&pSVar9->simParams_->components_);
  ppCVar3 = local_2908.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  uVar18 = (long)local_2908.
                 super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_2908.
                 super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  local_2998 = pSVar9;
  if ((long)local_2908.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_2908.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    local_2740._M_mt._M_x[0] = 0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&local_2ac8,(iterator)0x0,(double *)&local_2740);
  }
  else {
    uVar17 = (ulong)local_2838.molFraction_given;
    if (uVar18 == uVar17) {
      if (local_2908.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_2908.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar19 = uVar18 + (uVar18 == 0);
        lVar21 = 0;
        do {
          if (local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_2ac8,
                       (iterator)
                       local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       (double *)((long)local_2838.molFraction_arg + lVar21));
          }
          else {
            *local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 *(double *)((long)local_2838.molFraction_arg + lVar21);
            local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          lVar21 = lVar21 + 8;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
    }
    else if (uVar18 - 1 == uVar17) {
      local_2740._M_mt._M_x[0] = 0x3ff0000000000000;
      if (uVar17 != 0) {
        lVar19 = 0;
        pdVar10 = (pointer)0x0;
        do {
          if (local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_2ac8,
                       (iterator)
                       local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       (double *)((long)local_2838.molFraction_arg + lVar19));
            pdVar10 = local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          }
          else {
            *local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 *(double *)((long)local_2838.molFraction_arg + lVar19);
            local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_2740.field_0._M_file =
               (void *)((double)local_2740.field_0._M_file - *(double *)((long)pdVar10 + lVar19));
          lVar19 = lVar19 + 8;
        } while (uVar17 << 3 != lVar19);
        if (local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_2740.field_0._M_file;
          local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          goto LAB_0012910c;
        }
      }
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_2ac8,
                 (iterator)
                 local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_2740);
    }
    else {
      memcpy(&painCave,
             "randomBuilder can\'t figure out molFractions for all of the components in the <MetaData> block."
             ,0x5f);
      painCave.isFatal = 1;
      simError();
    }
  }
LAB_0012910c:
  local_29f0 = local_2908.
               super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
  local_29a0 = ppCVar3;
  if (local_2908.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
      _M_impl.super__Vector_impl_data._M_finish == ppCVar3) {
    dVar24 = -1.0;
  }
  else {
    uVar17 = 0;
    dVar24 = 0.0;
    uVar22 = 0;
    uVar23 = 0;
    pdVar10 = local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13 = local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      uVar16 = (long)pdVar13 - (long)pdVar10 >> 3;
      if (uVar16 <= uVar17) {
LAB_00129d30:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar17);
      }
      local_2a78._8_4_ = uVar22;
      local_2a78._0_8_ = dVar24;
      local_2a78._12_4_ = uVar23;
      if (pdVar10[uVar17] <= 0.0 && pdVar10[uVar17] != 0.0) {
        builtin_strncpy(painCave.errMsg,"One of the requested molFractions was less than zero!",0x36
                       );
        painCave.isFatal = 1;
        simError();
        uVar16 = (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        pdVar10 = local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar13 = local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      if (uVar16 <= uVar17) goto LAB_00129d30;
      if (1.0 < pdVar10[uVar17]) {
        builtin_strncpy(painCave.errMsg,"One of the requested molFractions was greater than one!",
                        0x38);
        painCave.isFatal = 1;
        simError();
        uVar16 = (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        pdVar10 = local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar13 = local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      if (uVar16 <= uVar17) goto LAB_00129d30;
      uVar22 = local_2a78._8_4_;
      uVar23 = local_2a78._12_4_;
      dVar24 = local_2a78._0_8_ + pdVar10[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar18 + (uVar18 == 0) != uVar17);
    dVar24 = dVar24 + -1.0;
  }
  ppCVar3 = local_29a0;
  if (1e-06 < ABS(dVar24)) {
    builtin_strncpy(painCave.errMsg,"The sum of molFractions was not close enough to 1.0",0x34);
    painCave.isFatal = 1;
    simError();
  }
  local_2a7c = (int)local_2a50 * local_2838.nz_arg * local_2838.nx_arg * local_2838.ny_arg;
  local_2a78._0_8_ = (double)local_2a7c;
  local_29dc = local_2a7c;
  if (uVar18 != 1) {
    uVar17 = 0;
    do {
      if ((ulong)((long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar17) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar17);
      }
      local_2740._M_mt._M_x[0]._0_4_ =
           (int)(local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17] * (double)local_2a78._0_8_);
      if (local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_2aa8,
                   (iterator)
                   local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_2740);
      }
      else {
        *local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = (int)(local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17] * (double)local_2a78._0_8_);
        local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if ((ulong)((long)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar17) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar17);
      }
      local_2a7c = local_2a7c -
                   local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar18 - 1 != uVar17);
  }
  if (local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_2aa8,
               (iterator)
               local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_2a7c);
  }
  else {
    *local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = local_2a7c;
    local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_29e8 = uVar18;
  if (local_29f0 == ppCVar3) {
    dVar24 = 0.0;
    iVar7 = 0;
  }
  else {
    lVar19 = 0;
    dVar24 = 0.0;
    uVar17 = 0;
    iVar7 = 0;
    do {
      uVar16 = (long)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if (uVar16 <= uVar17) {
LAB_00129d41:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar17,uVar16);
      }
      iVar1 = local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar17];
      local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start[uVar17] = (double)iVar1 / (double)local_2a78._0_8_;
      local_2a88 = dVar24;
      local_2740.field_0._M_file =
           (void *)OpenMD::MoLocator::getMolMass
                             (*(MoleculeStamp **)
                               ((long)(local_2998->moleculeStamps_).
                                      super__Vector_base<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start + (lVar19 >> 0x1d)),
                              local_2998->forceField_);
      if (local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_2a08,
                   (iterator)
                   local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_2740);
      }
      else {
        *local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_2740.field_0._M_file;
        local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar16 = (long)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      if ((uVar16 <= uVar17) ||
         (uVar16 = (long)local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3, uVar16 <= uVar17))
      goto LAB_00129d41;
      iVar7 = iVar7 + iVar1;
      dVar24 = local_2a88 +
               (double)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar17] *
               local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17];
      uVar17 = uVar17 + 1;
      lVar19 = lVar19 + 0x100000000;
    } while (uVar18 + (uVar18 == 0) != uVar17);
  }
  if (iVar7 != local_29dc) {
    local_2a88 = dVar24;
    memcpy(&painCave,
           "Computed total number of molecules is not equal to the number of lattice sites!",0x50);
    painCave.isFatal = 1;
    simError();
    dVar24 = local_2a88;
  }
  local_2990 = pow(((double)(int)local_2a50 * 1.661 * (dVar24 / (double)iVar7)) /
                   local_2838.density_arg,0.3333333333333333);
  if (iStack_29d0._M_current == local_29c8) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&local_29d8,iStack_29d0,&local_2990);
  }
  else {
    *iStack_29d0._M_current = local_2990;
    iStack_29d0._M_current = iStack_29d0._M_current + 1;
  }
  (*local_2a58->_vptr_Lattice[3])(local_2a58,&local_29d8);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             &local_2740.field_0,&local_2a58->cellSitesOrt);
  uVar6 = local_2740.field_0._M_file;
  local_2a28.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a28.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a28.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a88 = 0.0;
  local_2968.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2968.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2968.super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < local_2838.nx_arg) {
    lVar19 = local_2a50 * 0x18;
    do {
      if (0 < local_2838.ny_arg) {
        auVar2._12_4_ = 0;
        auVar2._0_12_ = local_2a78._4_12_;
        local_2a78._0_16_ = auVar2 << 0x20;
        do {
          if (0 < local_2838.nz_arg) {
            iVar7 = 0;
            do {
              OpenMD::Lattice::getLatticePointsPos
                        (local_2a58,&local_2948,SUB84(local_2a88,0),local_2a78._0_4_,iVar7);
              if (0 < (int)local_2a50) {
                lVar21 = 0;
                do {
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  push_back(&local_2a28,
                            (value_type *)
                            ((long)((local_2948.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_Vector<double,_3U>).data_ + lVar21));
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  push_back(&local_2968,(value_type *)(uVar6 + lVar21));
                  lVar21 = lVar21 + 0x18;
                } while (lVar19 != lVar21);
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 != local_2838.nz_arg);
          }
          iVar7 = local_2a78._0_4_ + 1;
          local_2a78._0_4_ = iVar7;
        } while (iVar7 != local_2838.ny_arg);
      }
      uVar8 = SUB84(local_2a88,0) + 1;
      local_2a88 = (double)(ulong)uVar8;
    } while (uVar8 != local_2838.nx_arg);
  }
  sVar4 = local_2988._M_string_length;
  strlen(local_2838.output_arg);
  std::__cxx11::string::_M_replace((ulong)&local_2988,0,(char *)sVar4,(ulong)local_2838.output_arg);
  std::vector<int,_std::allocator<int>_>::vector(&local_28c8,&local_2aa8);
  createMdFile(&local_2928,&local_2988,&local_28c8);
  if (local_28c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (*local_2998->_vptr_SimInfo[1])();
  local_28f0.mdFileName_._M_dataplus._M_p = (pointer)&local_28f0.mdFileName_.field_2;
  local_28f0._vptr_SimCreator = local_2a60;
  local_28f0.mdFileName_._M_string_length = 0;
  local_28f0.mdFileName_.field_2._M_local_buf[0] = '\0';
  pSVar9 = OpenMD::SimCreator::createSim(&local_28f0,&local_2988,false);
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
       (double)local_2838.nx_arg * local_2990;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
       (double)local_2838.ny_arg * local_2990;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
       (double)local_2838.nz_arg * local_2990;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
  local_2888.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
  OpenMD::Snapshot::setHmat(pSVar9->sman_->currentSnapshot_,&local_2888);
  local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (int *)0x0;
  local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  if (local_2a28.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      local_2a28.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start) {
    uVar18 = 0;
    pVVar11 = local_2a28.
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pVVar14 = local_2a28.
              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      local_2740._M_mt._M_x[0]._0_4_ = (int)uVar18;
      if (local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_2a48,
                   (iterator)
                   local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_2740);
        pVVar11 = local_2a28.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pVVar14 = local_2a28.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = (int)uVar18;
        local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)(((long)pVVar14 - (long)pVVar11 >> 3) * -0x5555555555555555));
  }
  std::random_device::random_device((random_device *)&local_2740.field_0);
  uVar8 = std::random_device::_M_getval();
  ppCVar5 = local_29a0;
  ppCVar3 = local_29f0;
  local_13b8._M_x[0] = (unsigned_long)uVar8;
  lVar19 = 1;
  uVar18 = local_13b8._M_x[0];
  do {
    uVar18 = (ulong)(((uint)(uVar18 >> 0x1e) ^ (uint)uVar18) * 0x6c078965 + (int)lVar19);
    local_13b8._M_x[lVar19] = uVar18;
    lVar19 = lVar19 + 1;
  } while (lVar19 != 0x270);
  local_13b8._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_13b8);
  local_2a78._0_8_ = pSVar9;
  if (ppCVar3 != ppCVar5) {
    p_Var20 = &(pSVar9->molecules_)._M_t._M_impl.super__Rb_tree_header;
    local_29e8 = local_29e8 + (local_29e8 == 0);
    uVar18 = 0;
    lVar19 = 0;
    do {
      this_00 = (MoLocator *)operator_new(0x30);
      OpenMD::MoLocator::MoLocator
                (this_00,*(MoleculeStamp **)
                          (*(long *)(local_2a78._0_8_ + 0xf0) + (long)(int)uVar18 * 8),
                 *(ForceField **)(local_2a78._0_8_ + 8));
      if ((ulong)((long)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar18) {
LAB_00129d1f:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar18);
      }
      lVar19 = (long)(int)lVar19;
      iVar7 = 0;
      while (iVar7 < local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar18]) {
        p_Var15 = *(_Base_ptr *)(local_2a78._0_8_ + 0xb8);
        p_Var12 = &p_Var20->_M_header;
        if (p_Var15 == (_Base_ptr)0x0) {
LAB_00129a30:
          mol = (Molecule *)0x0;
        }
        else {
          do {
            if (lVar19 <= (int)p_Var15[1]._M_color) {
              p_Var12 = p_Var15;
            }
            p_Var15 = (&p_Var15->_M_left)[(int)p_Var15[1]._M_color < lVar19];
          } while (p_Var15 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var12 == p_Var20) || (lVar19 < (int)p_Var12[1]._M_color))
          goto LAB_00129a30;
          mol = (Molecule *)p_Var12[1]._M_parent;
        }
        OpenMD::MoLocator::placeMol
                  (this_00,local_2a28.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                           local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar19],
                   local_2968.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar19],mol);
        lVar19 = lVar19 + 1;
        iVar7 = iVar7 + 1;
        if ((ulong)((long)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar18) goto LAB_00129d1f;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != local_29e8);
  }
  this_01 = (DumpWriter *)operator_new(0x60);
  OpenMD::DumpWriter::DumpWriter(this_01,(SimInfo *)local_2a78._0_8_,&local_2988);
  OpenMD::DumpWriter::writeDump(this_01);
  OpenMD::DumpWriter::~DumpWriter(this_01);
  operator_delete(this_01,0x60);
  snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",
           local_2988._M_dataplus._M_p);
  painCave.isFatal = 0;
  painCave.severity = 3;
  simError();
  std::random_device::_M_fini();
  if (local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_28f0._vptr_SimCreator = local_2a60;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28f0.mdFileName_._M_dataplus._M_p != &local_28f0.mdFileName_.field_2) {
    operator_delete(local_28f0.mdFileName_._M_dataplus._M_p,
                    CONCAT71(local_28f0.mdFileName_.field_2._M_allocated_capacity._1_7_,
                             local_28f0.mdFileName_.field_2._M_local_buf[0]) + 1);
  }
  if (local_2968.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2968.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2968.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2968.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2a28.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a28.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a28.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a28.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2aa8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2ac8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2908.super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2908.
                    super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2908.
                          super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2908.
                          super__Vector_base<OpenMD::Component_*,_std::allocator<OpenMD::Component_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_28b0._vptr_SimCreator = local_2a60;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28b0.mdFileName_._M_dataplus._M_p != &local_28b0.mdFileName_.field_2) {
    operator_delete(local_28b0.mdFileName_._M_dataplus._M_p,
                    CONCAT71(local_28b0.mdFileName_.field_2._M_allocated_capacity._1_7_,
                             local_28b0.mdFileName_.field_2._M_local_buf[0]) + 1);
  }
  if ((void *)uVar6 != (void *)0x0) {
    operator_delete((void *)uVar6,local_2740._M_mt._M_x[2] - uVar6);
  }
  if (local_2948.
      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2948.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2948.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2948.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_29d8 != (void *)0x0) {
    operator_delete(local_29d8,(long)local_29c8 - (long)local_29d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2988._M_dataplus._M_p != &local_2988.field_2) {
    operator_delete(local_2988._M_dataplus._M_p,
                    CONCAT71(local_2988.field_2._M_allocated_capacity._1_7_,
                             local_2988.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2928._M_dataplus._M_p != &local_2928.field_2) {
    operator_delete(local_2928._M_dataplus._M_p,
                    CONCAT71(local_2928.field_2._M_allocated_capacity._1_7_,
                             local_2928.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_29c0._M_dataplus._M_p != &local_29c0.field_2) {
    operator_delete(local_29c0._M_dataplus._M_p,
                    CONCAT71(local_29c0.field_2._M_allocated_capacity._1_7_,
                             local_29c0.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  registerLattice();

  gengetopt_args_info args_info;
  std::string latticeType;
  std::string inputFileName;
  std::string outputFileName;
  Lattice* simpleLat;
  RealType latticeConstant;
  std::vector<RealType> lc;
  const RealType rhoConvertConst = 1.661;
  RealType density;
  int nx, ny, nz;
  Mat3x3d hmat;
  MoLocator* locator;
  std::vector<Vector3d> latticePos;
  std::vector<Vector3d> latticeOrt;
  int nMolPerCell;
  DumpWriter* writer;

  // parse command line arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) exit(1);

  density = args_info.density_arg;

  // get lattice type
  latticeType = "FCC";
  if (args_info.lattice_given) { latticeType = args_info.lattice_arg; }

  simpleLat = LatticeFactory::getInstance().createLattice(latticeType);

  if (simpleLat == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Lattice Factory can not create %s lattice\n",
             latticeType.c_str());
    painCave.isFatal = 1;
    simError();
  }
  nMolPerCell = simpleLat->getNumSitesPerCell();

  // get the number of unit cells in each direction:

  nx = args_info.nx_arg;

  if (nx <= 0) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The number of unit cells in the x direction "
             "must be greater than 0.");
    painCave.isFatal = 1;
    simError();
  }

  ny = args_info.ny_arg;

  if (ny <= 0) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The number of unit cells in the y direction "
             "must be greater than 0.");
    painCave.isFatal = 1;
    simError();
  }

  nz = args_info.nz_arg;

  if (nz <= 0) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The number of unit cells in the z direction "
             "must be greater than 0.");
    painCave.isFatal = 1;
    simError();
  }

  int nSites = nMolPerCell * nx * ny * nz;

  // get input file name
  if (args_info.inputs_num)
    inputFileName = args_info.inputs[0];
  else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "No input .omd file name was specified "
             "on the command line");
    painCave.isFatal = 1;
    simError();
  }

  // parse md file and set up the system

  SimCreator oldCreator;
  SimInfo* oldInfo   = oldCreator.createSim(inputFileName, false);
  Globals* simParams = oldInfo->getSimParams();

  // Calculate lattice constant (in Angstroms)

  std::vector<Component*> components = simParams->getComponents();
  std::vector<RealType> molFractions;
  std::vector<RealType> molecularMasses;
  std::vector<int> nMol;
  std::size_t nComponents = components.size();

  if (nComponents == 1) {
    molFractions.push_back(1.0);
  } else {
    if (args_info.molFraction_given == nComponents) {
      for (std::size_t i = 0; i < nComponents; i++) {
        molFractions.push_back(args_info.molFraction_arg[i]);
      }
    } else if (args_info.molFraction_given == nComponents - 1) {
      RealType remainingFraction = 1.0;
      for (std::size_t i = 0; i < nComponents - 1; i++) {
        molFractions.push_back(args_info.molFraction_arg[i]);
        remainingFraction -= molFractions[i];
      }
      molFractions.push_back(remainingFraction);
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "randomBuilder can't figure out molFractions "
               "for all of the components in the <MetaData> block.");
      painCave.isFatal = 1;
      simError();
    }
  }

  // do some sanity checking:

  RealType totalFraction = 0.0;

  for (std::size_t i = 0; i < nComponents; i++) {
    if (molFractions.at(i) < 0.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "One of the requested molFractions was"
               " less than zero!");
      painCave.isFatal = 1;
      simError();
    }
    if (molFractions.at(i) > 1.0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "One of the requested molFractions was"
               " greater than one!");
      painCave.isFatal = 1;
      simError();
    }
    totalFraction += molFractions.at(i);
  }
  if (abs(totalFraction - 1.0) > 1e-6) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "The sum of molFractions was not close enough to 1.0");
    painCave.isFatal = 1;
    simError();
  }

  int remaining = nSites;
  for (std::size_t i = 0; i < nComponents - 1; i++) {
    nMol.push_back(int((RealType)nSites * molFractions.at(i)));
    remaining -= nMol.at(i);
  }
  nMol.push_back(remaining);

  // recompute actual mol fractions and perform final sanity check:

  int totalMolecules = 0;
  RealType totalMass = 0.0;
  for (std::size_t i = 0; i < nComponents; i++) {
    molFractions[i] = (RealType)(nMol.at(i)) / (RealType)nSites;
    totalMolecules += nMol.at(i);
    molecularMasses.push_back(MoLocator::getMolMass(
        oldInfo->getMoleculeStamp(i), oldInfo->getForceField()));
    totalMass += (RealType)(nMol.at(i)) * molecularMasses.at(i);
  }
  RealType avgMass = totalMass / (RealType)totalMolecules;

  if (totalMolecules != nSites) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Computed total number of molecules is not equal "
             "to the number of lattice sites!");
    painCave.isFatal = 1;
    simError();
  }

  latticeConstant = pow(rhoConvertConst * nMolPerCell * avgMass / density,
                        (RealType)(1.0 / 3.0));

  // Set the lattice constant

  lc.push_back(latticeConstant);
  simpleLat->setLatticeConstant(lc);

  // Calculate the lattice sites and fill the lattice vector.

  // Get the standard orientations of the cell sites

  latticeOrt = simpleLat->getLatticePointsOrt();

  vector<Vector3d> sites;
  vector<Vector3d> orientations;

  for (int i = 0; i < nx; i++) {
    for (int j = 0; j < ny; j++) {
      for (int k = 0; k < nz; k++) {
        // Get the position of the cell sites

        simpleLat->getLatticePointsPos(latticePos, i, j, k);

        for (int l = 0; l < nMolPerCell; l++) {
          sites.push_back(latticePos[l]);
          orientations.push_back(latticeOrt[l]);
        }
      }
    }
  }

  outputFileName = args_info.output_arg;

  // create a new .omd file on the fly which corrects the number of molecules

  createMdFile(inputFileName, outputFileName, nMol);

  delete oldInfo;

  // We need to read in the new SimInfo object, then Parse the
  // md file and set up the system

  SimCreator newCreator;
  SimInfo* newInfo = newCreator.createSim(outputFileName, false);

  // fill Hmat

  hmat(0, 0) = nx * latticeConstant;
  hmat(0, 1) = 0.0;
  hmat(0, 2) = 0.0;

  hmat(1, 0) = 0.0;
  hmat(1, 1) = ny * latticeConstant;
  hmat(1, 2) = 0.0;

  hmat(2, 0) = 0.0;
  hmat(2, 1) = 0.0;
  hmat(2, 2) = nz * latticeConstant;

  // Set Hmat

  newInfo->getSnapshotManager()->getCurrentSnapshot()->setHmat(hmat);

  // place the molecules

  // Randomize a vector of ints:

  vector<int> ids;
  for (std::size_t i = 0; i < sites.size(); i++)
    ids.push_back(i);

  /* Set up the random number generator engine */
  std::random_device rd;   // Non-deterministic, uniformly-distributed integer
                           // random number generator
  std::mt19937 gen(rd());  // 32-bit Mersenne Twister random number engine

  std::shuffle(ids.begin(), ids.end(), gen);

  Molecule* mol;
  int l = 0;
  for (std::size_t i = 0; i < nComponents; i++) {
    locator =
        new MoLocator(newInfo->getMoleculeStamp(i), newInfo->getForceField());
    for (int n = 0; n < nMol.at(i); n++) {
      mol = newInfo->getMoleculeByGlobalIndex(l);
      locator->placeMol(sites[ids[l]], orientations[ids[l]], mol);
      l++;
    }
  }

  // Create DumpWriter and write out the coordinates

  writer = new DumpWriter(newInfo, outputFileName);

  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "error in creating DumpWriter");
    painCave.isFatal = 1;
    simError();
  }

  writer->writeDump();

  // deleting the writer will put the closing at the end of the dump file.

  delete writer;

  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been "
           "generated.\n",
           outputFileName.c_str());
  painCave.isFatal  = 0;
  painCave.severity = OPENMD_INFO;
  simError();
  return 0;
}